

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
* __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::Take
          (IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          ,size_t count)

{
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&> local_68;
  size_t local_20;
  size_t count_local;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this_local;
  
  local_20 = count;
  count_local = (size_t)this;
  this_local = (IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>
                *)__return_storage_ptr__;
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::TakeState
            (&local_68,&this->source,count);
  IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_68);
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::~TakeState
            (&local_68);
  return __return_storage_ptr__;
}

Assistant:

auto Take(size_t count) 
		{ 
			return IEnumerableCore<TakeState<S, T>>(
				TakeState<S, T>(std::move(source), count)
			);
		}